

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O0

PrettyPrinterNode * getNextListOnLine(PrettyPrinterNode *start)

{
  long in_RDI;
  bool bVar1;
  int line;
  PrettyPrinterNode *local_10;
  
  if (((*(byte *)(in_RDI + 0x18) ^ 0xff) & 1) == 0) {
    __assert_fail("!start->is_line_separator",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/LispPrint.cpp"
                  ,0x11e,"PrettyPrinterNode *getNextListOnLine(PrettyPrinterNode *)");
  }
  if ((*(long *)(in_RDI + 0x20) != 0) && ((*(byte *)(*(long *)(in_RDI + 0x20) + 0x18) & 1) == 0)) {
    local_10 = *(PrettyPrinterNode **)(in_RDI + 0x20);
    while( true ) {
      bVar1 = false;
      if ((local_10->is_line_separator & 1U) == 0) {
        bVar1 = local_10->line == *(int *)(in_RDI + 8);
      }
      if (!bVar1) {
        return (PrettyPrinterNode *)0x0;
      }
      if (local_10->tok->kind == OPEN_PAREN) {
        return local_10;
      }
      if (local_10->next == (PrettyPrinterNode *)0x0) break;
      local_10 = local_10->next;
    }
  }
  return (PrettyPrinterNode *)0x0;
}

Assistant:

static PrettyPrinterNode* getNextListOnLine(PrettyPrinterNode* start) {
  int line = start->line;
  assert(!start->is_line_separator);
  if(!start->next || start->next->is_line_separator) return nullptr;
  start = start->next;
  while(!start->is_line_separator && start->line == line) {
    if(start->tok->kind == TokenKind::OPEN_PAREN) return start;
    if(!start->next) return nullptr;
    start = start->next;
  }
  return nullptr;
}